

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O1

ChVector2<double> __thiscall
chrono::ChFile_ps::To_graph_from_page(ChFile_ps *this,ChVector2<double> *mv_p)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ChVector2<double> *v_g;
  undefined8 *in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ChVector2<double> CVar9;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  dVar1 = (this->Gs_p).m_data[1];
  dVar2 = (this->G_p).m_data[1];
  auVar8._0_8_ = 1.0 / (this->Gz).m_data[0];
  auVar8._8_8_ = 0x3ff0000000000000;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (this->Gc_g).m_data[0];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = mv_p->m_data[0] - ((this->Gs_p).m_data[0] * 0.5 + (this->G_p).m_data[0]);
  auVar3 = vfmadd213sd_fma(auVar8,auVar6,auVar3);
  *in_RDI = auVar3._0_8_;
  dVar1 = mv_p->m_data[1] - (dVar1 * 0.5 + dVar2);
  auVar7._0_8_ = 1.0 / (this->Gz).m_data[1];
  auVar7._8_8_ = 0x3ff0000000000000;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (this->Gc_g).m_data[1];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar1;
  auVar3 = vfmadd213sd_fma(auVar7,auVar5,auVar4);
  CVar9.m_data[1] = auVar3._0_8_;
  in_RDI[1] = CVar9.m_data[1];
  CVar9.m_data[0] = dVar1;
  return (ChVector2<double>)CVar9.m_data;
}

Assistant:

ChVector2<> ChFile_ps::To_graph_from_page(ChVector2<> mv_p) const {
    ChVector2<> v_g;
    ChVector2<> mGc_p;
    mGc_p.x() = G_p.x() + (Gs_p.x()) / 2;
    mGc_p.y() = G_p.y() + (Gs_p.y()) / 2;
    v_g.x() = (mv_p.x() - mGc_p.x()) * (1 / Gz.x()) + Gc_g.x();
    v_g.y() = (mv_p.y() - mGc_p.y()) * (1 / Gz.y()) + Gc_g.y();
    return v_g;
}